

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlAddDefAttrs(xmlParserCtxtPtr ctxt,xmlChar *fullname,xmlChar *fullattr,xmlChar *value)

{
  int iVar1;
  xmlEntityPtr pxVar2;
  uint uVar3;
  void *pvVar4;
  xmlHashTablePtr pxVar5;
  xmlChar *pxVar6;
  int *payload;
  size_t sVar7;
  uint uVar8;
  xmlChar *pxVar9;
  xmlChar *pxVar10;
  int iVar11;
  ulong uVar12;
  xmlHashedString xVar13;
  int len;
  int local_48;
  uint local_44;
  int *local_40;
  xmlChar *local_38;
  
  if ((ctxt->attsSpecial != (xmlHashTablePtr)0x0) &&
     (pvVar4 = xmlHashLookup2(ctxt->attsSpecial,fullname,fullattr), pvVar4 != (void *)0x0)) {
    return;
  }
  local_38 = value;
  if (ctxt->attsDefault == (xmlHashTablePtr)0x0) {
    pxVar5 = xmlHashCreateDict(10,ctxt->dict);
    ctxt->attsDefault = pxVar5;
    if (pxVar5 == (xmlHashTablePtr)0x0) goto LAB_0013635d;
  }
  pxVar6 = xmlSplitQName3(fullname,&local_48);
  if (pxVar6 == (xmlChar *)0x0) {
    xVar13 = xmlDictLookupHashed(ctxt->dict,fullname,-1);
    pxVar6 = xVar13.name;
    if (pxVar6 == (xmlChar *)0x0) goto LAB_0013635d;
    pxVar9 = (xmlChar *)0x0;
  }
  else {
    xVar13 = xmlDictLookupHashed(ctxt->dict,pxVar6,-1);
    pxVar6 = xVar13.name;
    xVar13 = xmlDictLookupHashed(ctxt->dict,fullname,local_48);
    pxVar9 = xVar13.name;
    local_44 = xVar13.hashValue;
    if (pxVar6 == (xmlChar *)0x0 || pxVar9 == (xmlChar *)0x0) goto LAB_0013635d;
  }
  payload = (int *)xmlHashLookup2(ctxt->attsDefault,pxVar6,pxVar9);
  if (payload == (int *)0x0) {
    uVar12 = 4;
LAB_001361b7:
    local_40 = payload;
    payload = (int *)(*xmlRealloc)(payload,uVar12 << 6 | 8);
    if (payload == (int *)0x0) goto LAB_0013635d;
    if (local_40 == (int *)0x0) {
      *payload = 0;
    }
    payload[1] = (int)uVar12;
    iVar11 = xmlHashUpdateEntry2(ctxt->attsDefault,pxVar6,pxVar9,payload,(xmlHashDeallocator)0x0);
    if (iVar11 < 0) {
      (*xmlFree)(payload);
      goto LAB_0013635d;
    }
  }
  else {
    uVar3 = payload[1];
    if ((int)uVar3 <= *payload) {
      if (99999999 < uVar3) goto LAB_0013635d;
      uVar12 = 100000000;
      if (uVar3 < 0x2faf081) {
        uVar12 = (ulong)(uVar3 * 2);
      }
      goto LAB_001361b7;
    }
  }
  local_40 = payload;
  pxVar6 = xmlSplitQName3(fullattr,&local_48);
  if (pxVar6 == (xmlChar *)0x0) {
    xVar13 = xmlDictLookupHashed(ctxt->dict,fullattr,-1);
    pxVar6 = xVar13.name;
    if (pxVar6 == (xmlChar *)0x0) goto LAB_0013635d;
    uVar3 = xVar13.hashValue;
    pxVar9 = (xmlChar *)0x0;
  }
  else {
    xVar13 = xmlDictLookupHashed(ctxt->dict,pxVar6,-1);
    pxVar6 = xVar13.name;
    uVar3 = xVar13.hashValue;
    xVar13 = xmlDictLookupHashed(ctxt->dict,fullattr,local_48);
    pxVar9 = xVar13.name;
    local_44 = xVar13.hashValue;
    if (pxVar6 == (xmlChar *)0x0 || pxVar9 == (xmlChar *)0x0) goto LAB_0013635d;
  }
  pxVar10 = local_38;
  sVar7 = strlen((char *)local_38);
  local_48 = (int)sVar7;
  xVar13 = xmlDictLookupHashed(ctxt->dict,pxVar10,local_48);
  pxVar10 = xVar13.name;
  if (pxVar10 != (xmlChar *)0x0) {
    local_38 = (xmlChar *)CONCAT44(local_38._4_4_,xVar13.hashValue);
    sVar7 = strlen((char *)pxVar6);
    iVar11 = (int)sVar7;
    if (pxVar9 != (xmlChar *)0x0) {
      sVar7 = strlen((char *)pxVar9);
      iVar11 = iVar11 + (int)sVar7;
    }
    iVar1 = *local_40;
    uVar8 = 1;
    *local_40 = iVar1 + 1;
    local_40[(long)iVar1 * 0x10 + 6] = uVar3;
    *(xmlChar **)(local_40 + (long)iVar1 * 0x10 + 8) = pxVar6;
    local_40[(long)iVar1 * 0x10 + 2] = local_44;
    *(xmlChar **)(local_40 + (long)iVar1 * 0x10 + 4) = pxVar9;
    local_40[(long)iVar1 * 0x10 + 10] = (int)local_38;
    *(xmlChar **)(local_40 + (long)iVar1 * 0x10 + 0xc) = pxVar10;
    *(xmlChar **)(local_40 + (long)iVar1 * 0x10 + 0xe) = pxVar10 + local_48;
    if (ctxt->inSubset != 2) {
      pxVar2 = ctxt->input->entity;
      uVar8 = 0;
      if (pxVar2 != (xmlEntityPtr)0x0) {
        uVar8 = (uint)(pxVar2->etype == XML_EXTERNAL_PARAMETER_ENTITY);
      }
    }
    local_40[(long)iVar1 * 0x10 + 0x10] = uVar8;
    local_40[(long)iVar1 * 0x10 + 0x11] = iVar11 + local_48;
    return;
  }
LAB_0013635d:
  xmlCtxtErrMemory(ctxt);
  return;
}

Assistant:

static void
xmlAddDefAttrs(xmlParserCtxtPtr ctxt,
               const xmlChar *fullname,
               const xmlChar *fullattr,
               const xmlChar *value) {
    xmlDefAttrsPtr defaults;
    xmlDefAttr *attr;
    int len, expandedSize;
    xmlHashedString name;
    xmlHashedString prefix;
    xmlHashedString hvalue;
    const xmlChar *localname;

    /*
     * Allows to detect attribute redefinitions
     */
    if (ctxt->attsSpecial != NULL) {
        if (xmlHashLookup2(ctxt->attsSpecial, fullname, fullattr) != NULL)
	    return;
    }

    if (ctxt->attsDefault == NULL) {
        ctxt->attsDefault = xmlHashCreateDict(10, ctxt->dict);
	if (ctxt->attsDefault == NULL)
	    goto mem_error;
    }

    /*
     * split the element name into prefix:localname , the string found
     * are within the DTD and then not associated to namespace names.
     */
    localname = xmlSplitQName3(fullname, &len);
    if (localname == NULL) {
        name = xmlDictLookupHashed(ctxt->dict, fullname, -1);
	prefix.name = NULL;
    } else {
        name = xmlDictLookupHashed(ctxt->dict, localname, -1);
	prefix = xmlDictLookupHashed(ctxt->dict, fullname, len);
        if (prefix.name == NULL)
            goto mem_error;
    }
    if (name.name == NULL)
        goto mem_error;

    /*
     * make sure there is some storage
     */
    defaults = xmlHashLookup2(ctxt->attsDefault, name.name, prefix.name);
    if ((defaults == NULL) ||
        (defaults->nbAttrs >= defaults->maxAttrs)) {
        xmlDefAttrsPtr temp;
        int newSize;

        if (defaults == NULL) {
            newSize = 4;
        } else {
            if ((defaults->maxAttrs >= XML_MAX_ATTRS) ||
                ((size_t) defaults->maxAttrs >
                     SIZE_MAX / 2 / sizeof(temp[0]) - sizeof(*defaults)))
                goto mem_error;

            if (defaults->maxAttrs > XML_MAX_ATTRS / 2)
                newSize = XML_MAX_ATTRS;
            else
                newSize = defaults->maxAttrs * 2;
        }
        temp = xmlRealloc(defaults,
                          sizeof(*defaults) + newSize * sizeof(xmlDefAttr));
	if (temp == NULL)
	    goto mem_error;
        if (defaults == NULL)
            temp->nbAttrs = 0;
	temp->maxAttrs = newSize;
        defaults = temp;
	if (xmlHashUpdateEntry2(ctxt->attsDefault, name.name, prefix.name,
	                        defaults, NULL) < 0) {
	    xmlFree(defaults);
	    goto mem_error;
	}
    }

    /*
     * Split the attribute name into prefix:localname , the string found
     * are within the DTD and hen not associated to namespace names.
     */
    localname = xmlSplitQName3(fullattr, &len);
    if (localname == NULL) {
        name = xmlDictLookupHashed(ctxt->dict, fullattr, -1);
	prefix.name = NULL;
    } else {
        name = xmlDictLookupHashed(ctxt->dict, localname, -1);
	prefix = xmlDictLookupHashed(ctxt->dict, fullattr, len);
        if (prefix.name == NULL)
            goto mem_error;
    }
    if (name.name == NULL)
        goto mem_error;

    /* intern the string and precompute the end */
    len = strlen((const char *) value);
    hvalue = xmlDictLookupHashed(ctxt->dict, value, len);
    if (hvalue.name == NULL)
        goto mem_error;

    expandedSize = strlen((const char *) name.name);
    if (prefix.name != NULL)
        expandedSize += strlen((const char *) prefix.name);
    expandedSize += len;

    attr = &defaults->attrs[defaults->nbAttrs++];
    attr->name = name;
    attr->prefix = prefix;
    attr->value = hvalue;
    attr->valueEnd = hvalue.name + len;
    attr->external = PARSER_EXTERNAL(ctxt);
    attr->expandedSize = expandedSize;

    return;

mem_error:
    xmlErrMemory(ctxt);
}